

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerFlight::Tick(APowerFlight *this)

{
  AActor *pAVar1;
  int iVar2;
  
  if ((!multiplayer) && ((level.flags2._2_1_ & 1) != 0)) {
    iVar2 = *(int *)&(this->super_APowerup).super_AInventory.field_0x4fc;
    if (iVar2 != 0x7fffffff) {
      *(int *)&(this->super_APowerup).super_AInventory.field_0x4fc = iVar2 + 1;
      APowerup::Tick(&this->super_APowerup);
      return;
    }
    __assert_fail("EffectTics < INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_artifacts.cpp"
                  ,0x3eb,"virtual void APowerFlight::Tick()");
  }
  pAVar1 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar1 != (AActor *)0x0) {
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_004a1176;
    (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
  }
  (*(this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [4])(this);
LAB_004a1176:
  iVar2 = *(int *)&(this->super_APowerup).super_AInventory.field_0x4fc;
  if ((0 < iVar2) &&
     (iVar2 = iVar2 + -1, *(int *)&(this->super_APowerup).super_AInventory.field_0x4fc = iVar2,
     iVar2 == 0)) {
    (*(this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.
      _vptr_DObject[4])(this);
    return;
  }
  return;
}

Assistant:

void APowerFlight::Tick ()
{
	// The Wings of Wrath only expire in multiplayer and non-hub games
	if (!multiplayer && (level.flags2 & LEVEL2_INFINITE_FLIGHT))
	{
		assert(EffectTics < INT_MAX); // I can't see a game lasting nearly two years, but...
		EffectTics++;
	}

	Super::Tick ();

//	Owner->flags |= MF_NOGRAVITY;
//	Owner->flags2 |= MF2_FLY;
}